

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.c++
# Opt level: O0

String * kj::demangleTypeName(String *__return_storage_ptr__,char *name)

{
  String *pSVar1;
  ArrayDisposer *local_58;
  undefined1 local_40 [8];
  String result;
  char *buf;
  ArrayDisposer *pAStack_18;
  int status;
  char *name_local;
  
  pAStack_18 = (ArrayDisposer *)name;
  name_local = (char *)__return_storage_ptr__;
  if (name == (char *)0x0) {
    heapString(__return_storage_ptr__,"(nil)");
  }
  else {
    result.content.disposer = (ArrayDisposer *)__cxa_demangle(name,0,0,(long)&buf + 4);
    local_58 = result.content.disposer;
    if (result.content.disposer == (ArrayDisposer *)0x0) {
      local_58 = pAStack_18;
    }
    heapString((String *)local_40,(char *)local_58);
    free(result.content.disposer);
    pSVar1 = mv<kj::String>((String *)local_40);
    String::String(__return_storage_ptr__,pSVar1);
    String::~String((String *)local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

static kj::String demangleTypeName(const char* name) {
  if (name == nullptr) return kj::heapString("(nil)");

  int status;
  char* buf = abi::__cxa_demangle(name, nullptr, nullptr, &status);
  kj::String result = kj::heapString(buf == nullptr ? name : buf);
  free(buf);
  return kj::mv(result);
}